

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCore.c
# Opt level: O3

Vec_Int_t * Cnf_DeriveMappingArray(Aig_Man_t *pAig)

{
  int iVar1;
  Cnf_Man_t *p;
  Aig_MmFixed_t *p_00;
  Vec_Ptr_t *vMapped;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_40;
  
  p = Cnf_ManStart();
  p->pManAig = pAig;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p_00 = Dar_ManComputeCuts(pAig,10,0,0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeCuts = lVar4 + lVar3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Cnf_DeriveMapping(p);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeMap = lVar4 + lVar3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Cnf_ManTransferCuts(p);
  vMapped = Cnf_ManScanMapping(p,1,0);
  pVVar2 = Cnf_ManWriteCnfMapping(p,vMapped);
  if (vMapped->pArray != (void **)0x0) {
    free(vMapped->pArray);
  }
  free(vMapped);
  Aig_MmFixedStop(p_00,0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeSave = lVar4 + lVar3;
  Aig_ManResetRefs(pAig);
  Cnf_ManStop(p);
  return pVVar2;
}

Assistant:

Vec_Int_t * Cnf_DeriveMappingArray( Aig_Man_t * pAig )
{
    Vec_Int_t * vResult;
    Cnf_Man_t * p;
    Vec_Ptr_t * vMapped;
    Aig_MmFixed_t * pMemCuts;
    abctime clk;
    // allocate the CNF manager
    p = Cnf_ManStart();
    p->pManAig = pAig;

    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( pAig, 10, 0, 0 );
p->timeCuts = Abc_Clock() - clk;

    // find the mapping
clk = Abc_Clock();
    Cnf_DeriveMapping( p );
p->timeMap = Abc_Clock() - clk;
//    Aig_ManScanMapping( p, 1 );

    // convert it into CNF
clk = Abc_Clock();
    Cnf_ManTransferCuts( p );
    vMapped = Cnf_ManScanMapping( p, 1, 0 );
    vResult = Cnf_ManWriteCnfMapping( p, vMapped );
    Vec_PtrFree( vMapped );
    Aig_MmFixedStop( pMemCuts, 0 );
p->timeSave = Abc_Clock() - clk;

   // reset reference counters
    Aig_ManResetRefs( pAig );
//ABC_PRT( "Cuts   ", p->timeCuts );
//ABC_PRT( "Map    ", p->timeMap  );
//ABC_PRT( "Saving ", p->timeSave );
    Cnf_ManStop( p );
    return vResult;
}